

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

bool __thiscall CoreML::NeuralNetworkShaper::AllShapesDone(NeuralNetworkShaper *this)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  _Self local_28;
  _Self local_20;
  iterator it;
  NeuralNetworkShaper *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::begin(&this->blobColors);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         ::end(&this->blobColors);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return true;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator->(&local_20);
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&ppVar2->second);
    if ((int)sVar3 != this->numColors) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator++(&local_20,0);
  }
  return false;
}

Assistant:

bool NeuralNetworkShaper::AllShapesDone() {
    for (auto it = blobColors.begin(); it != blobColors.end(); it++) {
        if (static_cast<int>(it->second.size()) != numColors) {
            return false;
        }
    }
    return true;
}